

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O2

void __thiscall
QMakeEvaluator::visitProFunctionDef(QMakeEvaluator *this,ushort tok,ProKey *name,ushort *tokPtr)

{
  undefined6 in_register_00000032;
  char16_t *pcVar1;
  long in_FS_OFFSET;
  ProFunctionDef local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.m_pro = (this->m_current).pro;
  pcVar1 = ((local_20.m_pro)->m_proitems).d.ptr;
  if (pcVar1 == (char16_t *)0x0) {
    pcVar1 = (char16_t *)&QString::_empty;
  }
  local_20.m_offset = (int)((ulong)((long)tokPtr - (long)pcVar1) >> 1);
  ((local_20.m_pro)->m_refCount).m_cnt = ((local_20.m_pro)->m_refCount).m_cnt + 1;
  QHash<ProKey,ProFunctionDef>::emplace<ProFunctionDef_const&>
            ((QHash<ProKey,ProFunctionDef> *)
             (&(this->m_functionDefs).testFunctions +
             ((int)CONCAT62(in_register_00000032,tok) != 0x1a)),name,&local_20);
  ProFunctionDef::~ProFunctionDef(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMakeEvaluator::visitProFunctionDef(
        ushort tok, const ProKey &name, const ushort *tokPtr)
{
    QHash<ProKey, ProFunctionDef> *hash =
            (tok == TokTestDef
             ? &m_functionDefs.testFunctions
             : &m_functionDefs.replaceFunctions);
    hash->insert(name, ProFunctionDef(m_current.pro, tokPtr - m_current.pro->tokPtr()));
}